

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O3

void helper_sve_sqaddi_d_aarch64(void *d,void *a,int64_t b,uint32_t desc)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = 0;
  do {
    uVar1 = *(ulong *)((long)a + uVar3);
    uVar4 = uVar1 + b;
    uVar2 = 0x7fffffffffffffff;
    if (-1 < (long)uVar4) {
      uVar2 = 0x8000000000000000;
    }
    if (-1 < (long)((uVar4 ^ uVar1) & ~(uVar1 ^ b))) {
      uVar2 = uVar4;
    }
    *(ulong *)((long)d + uVar3) = uVar2;
    uVar3 = uVar3 + 8;
  } while (uVar3 < (desc & 0x1f) * 8 + 8);
  return;
}

Assistant:

void HELPER(sve_sqaddi_d)(void *d, void *a, int64_t b, uint32_t desc)
{
    intptr_t i, oprsz = simd_oprsz(desc);

    for (i = 0; i < oprsz; i += sizeof(int64_t)) {
        int64_t ai = *(int64_t *)((char *)a + i);
        int64_t r = ai + b;
        if (((r ^ ai) & ~(ai ^ b)) < 0) {
            /* Signed overflow.  */
            r = (r < 0 ? INT64_MAX : INT64_MIN);
        }
        *(int64_t *)((char *)d + i) = r;
    }
}